

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O2

void __thiscall
soul::RenderingVenue::Pimpl::SessionImpl::render(SessionImpl *this,uint32_t numFrames)

{
  Performer *pPVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  InputActions actions;
  InputEndpointActions local_48;
  Performer *local_40;
  function<unsigned_int_(unsigned_int)> *local_38;
  
  uVar4 = (ulong)numFrames;
  if ((this->beginNextBlockCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(unsigned_int)>::operator()(&this->beginNextBlockCallback,numFrames);
  }
  local_38 = &this->getBlockSizeCallback;
  do {
    uVar3 = (uint)uVar4;
    if (uVar3 == 0) {
      return;
    }
    uVar5 = (ulong)this->maxBlockSize;
    if (uVar3 < this->maxBlockSize) {
      uVar5 = uVar4;
    }
    if ((this->getBlockSizeCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
      uVar2 = std::function<unsigned_int_(unsigned_int)>::operator()(local_38,(uint)uVar5);
      if (uVar2 < (uint)uVar5) {
        uVar5 = (ulong)uVar2;
      }
      if ((int)uVar5 == 0) {
        throwInternalCompilerError("render",0x19d);
      }
    }
    pPVar1 = (this->performer)._M_t.
             super___uniq_ptr_impl<soul::Performer,_std::default_delete<soul::Performer>_>._M_t.
             super__Tuple_impl<0UL,_soul::Performer_*,_std::default_delete<soul::Performer>_>.
             super__Head_base<0UL,_soul::Performer_*,_false>._M_head_impl;
    uVar2 = (uint)uVar5;
    (**(code **)(*(long *)pPVar1 + 0x68))(pPVar1,uVar5);
    if ((this->preRenderCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
      local_40 = (this->performer)._M_t.
                 super___uniq_ptr_impl<soul::Performer,_std::default_delete<soul::Performer>_>._M_t.
                 super__Tuple_impl<0UL,_soul::Performer_*,_std::default_delete<soul::Performer>_>.
                 super__Head_base<0UL,_soul::Performer_*,_false>._M_head_impl;
      local_48._vptr_InputEndpointActions = (_func_int **)&PTR__InputEndpointActions_00333988;
      std::function<void_(soul::Venue::Session::InputEndpointActions_&,_unsigned_int)>::operator()
                (&this->preRenderCallback,&local_48,uVar2);
    }
    (**(code **)(*(long *)(this->performer)._M_t.
                          super___uniq_ptr_impl<soul::Performer,_std::default_delete<soul::Performer>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_soul::Performer_*,_std::default_delete<soul::Performer>_>
                          .super__Head_base<0UL,_soul::Performer_*,_false>._M_head_impl + 0xa8))();
    if ((this->postRenderCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
      local_40 = (this->performer)._M_t.
                 super___uniq_ptr_impl<soul::Performer,_std::default_delete<soul::Performer>_>._M_t.
                 super__Tuple_impl<0UL,_soul::Performer_*,_std::default_delete<soul::Performer>_>.
                 super__Head_base<0UL,_soul::Performer_*,_false>._M_head_impl;
      local_48._vptr_InputEndpointActions = (_func_int **)&PTR__OutputEndpointActions_003339f0;
      std::function<void_(soul::Venue::Session::OutputEndpointActions_&,_unsigned_int)>::operator()
                (&this->postRenderCallback,(OutputEndpointActions *)&local_48,uVar2);
    }
    LOCK();
    (this->totalFramesRendered).super___atomic_base<unsigned_long>._M_i =
         (this->totalFramesRendered).super___atomic_base<unsigned_long>._M_i + uVar5;
    UNLOCK();
    uVar4 = (ulong)(uVar3 - uVar2);
  } while( true );
}

Assistant:

void render (uint32_t numFrames)
        {
            if (beginNextBlockCallback != nullptr)
                beginNextBlockCallback (numFrames);

            while (numFrames != 0)
            {
                auto framesToDo = std::min (maxBlockSize, numFrames);

                if (getBlockSizeCallback != nullptr)
                {
                    framesToDo = std::min (framesToDo, getBlockSizeCallback (framesToDo));

                    if (framesToDo == 0)
                    {
                        SOUL_ASSERT_FALSE; // should handle this error case?
                        break;
                    }
                }

                performer->prepare (framesToDo);

                if (preRenderCallback != nullptr)
                {
                    InputActions actions (*performer);
                    preRenderCallback (actions, framesToDo);
                }

                performer->advance();

                if (postRenderCallback != nullptr)
                {
                    OutputActions actions (*performer);
                    postRenderCallback (actions, framesToDo);
                }

                totalFramesRendered += framesToDo;
                numFrames -= framesToDo;
            }
        }